

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationUtil.cpp
# Opt level: O2

string * __thiscall
vkt::synchronization::getResourceName_abi_cxx11_
          (string *__return_storage_ptr__,synchronization *this,ResourceDescription *resource)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  char *__s;
  allocator<char> local_289;
  int local_288;
  int local_284;
  string local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  string local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_200;
  string local_1e0;
  string local_1c0 [32];
  ostringstream str;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
  iVar1 = *(int *)this;
  if (iVar1 == 1) {
    poVar3 = std::operator<<((ostream *)&str,"image_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(this + 4));
    iVar1 = *(int *)(this + 8);
    if (iVar1 < 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_220,"",(allocator<char> *)&local_240);
    }
    else {
      local_284 = iVar1;
      de::toString<int>(&local_240,&local_284);
      std::operator+(&local_220,"x",&local_240);
    }
    poVar3 = std::operator<<(poVar3,(string *)&local_220);
    iVar2 = *(int *)(this + 0xc);
    if (iVar2 < 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_260,"",(allocator<char> *)&local_280);
    }
    else {
      local_288 = iVar2;
      de::toString<int>(&local_280,&local_288);
      std::operator+(&local_260,"x",&local_280);
    }
    poVar3 = std::operator<<(poVar3,(string *)&local_260);
    poVar3 = std::operator<<(poVar3,"_");
    __s = ::vk::getFormatName(*(VkFormat *)(this + 0x18));
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,__s,&local_289);
    de::toLower(&local_1e0,&local_200);
    std::__cxx11::string::substr((ulong)local_1c0,(ulong)&local_1e0);
    std::operator<<(poVar3,local_1c0);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_260);
    if (0 < iVar2) {
      std::__cxx11::string::~string((string *)&local_280);
    }
    std::__cxx11::string::~string((string *)&local_220);
    if (0 < iVar1) {
      std::__cxx11::string::~string((string *)&local_240);
    }
  }
  else if (iVar1 == 0) {
    poVar3 = std::operator<<((ostream *)&str,"buffer_");
    std::ostream::operator<<(poVar3,*(int *)(this + 4));
  }
  else if (iVar1 - 2U < 3) {
    std::operator<<((ostream *)&str,"indirect_buffer");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
  return __return_storage_ptr__;
}

Assistant:

std::string getResourceName (const ResourceDescription& resource)
{
	std::ostringstream str;

	if (resource.type == RESOURCE_TYPE_BUFFER)
		str << "buffer_" << resource.size.x();
	else if (resource.type == RESOURCE_TYPE_IMAGE)
	{
		str << "image_" << resource.size.x()
						<< (resource.size.y() > 0 ? "x" + de::toString(resource.size.y()) : "")
						<< (resource.size.z() > 0 ? "x" + de::toString(resource.size.z()) : "")
			<< "_" << de::toLower(getFormatName(resource.imageFormat)).substr(10);
	}
	else if (isIndirectBuffer(resource.type))
		str << "indirect_buffer";
	else
		DE_ASSERT(0);

	return str.str();
}